

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

int cmsysProcess_SetCommand(cmsysProcess *cp,char **command)

{
  int iVar1;
  char **ppcVar2;
  long lVar3;
  
  if (cp == (cmsysProcess *)0x0) {
    iVar1 = 0;
  }
  else {
    for (lVar3 = 0; lVar3 < cp->NumberOfCommands; lVar3 = lVar3 + 1) {
      for (ppcVar2 = cp->Commands[lVar3]; *ppcVar2 != (char *)0x0; ppcVar2 = ppcVar2 + 1) {
        free(*ppcVar2);
      }
      free(cp->Commands[lVar3]);
    }
    cp->NumberOfCommands = 0;
    if (cp->Commands != (char ***)0x0) {
      free(cp->Commands);
      cp->Commands = (char ***)0x0;
    }
    if (command != (char **)0x0) {
      iVar1 = cmsysProcess_AddCommand(cp,command);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int kwsysProcess_SetCommand(kwsysProcess* cp, char const* const* command)
{
  int i;
  if (!cp) {
    return 0;
  }
  for (i = 0; i < cp->NumberOfCommands; ++i) {
    char** c = cp->Commands[i];
    while (*c) {
      free(*c++);
    }
    free(cp->Commands[i]);
  }
  cp->NumberOfCommands = 0;
  if (cp->Commands) {
    free(cp->Commands);
    cp->Commands = 0;
  }
  if (command) {
    return kwsysProcess_AddCommand(cp, command);
  }
  return 1;
}